

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecc-ssh.c
# Opt level: O0

ssh_key * eddsa_new_priv_openssh(ssh_keyalg *alg,BinarySource *src)

{
  _Bool _Var1;
  ec_curve *curve_00;
  undefined8 *puVar2;
  EdwardsPoint *pEVar3;
  mp_int *pmVar4;
  ptrlen pl1;
  ptrlen pVar5;
  ptrlen pl2;
  eddsa_key *ek;
  ptrlen pubkey_copy_pl;
  ptrlen privkey_pl;
  BinarySource subsrc [1];
  ptrlen privkey_extended_pl;
  ptrlen pubkey_pl;
  ec_curve *curve;
  ecsign_extra *extra;
  BinarySource *src_local;
  ssh_keyalg *alg_local;
  
  curve_00 = (ec_curve *)(**alg->extra)();
  if (curve_00->type == EC_EDWARDS) {
    pl1 = BinarySource_get_string(src->binarysource_);
    pVar5 = BinarySource_get_string(src->binarysource_);
    if ((src->binarysource_->err == BSE_NO_ERROR) &&
       (pubkey_pl.ptr = (void *)pl1.len, pubkey_pl.ptr == (void *)curve_00->fieldBytes)) {
      BinarySource_INIT__((BinarySource *)&privkey_pl.len,pVar5);
      pVar5 = BinarySource_get_data((BinarySource *)subsrc[0]._24_8_,curve_00->fieldBytes);
      pl2 = BinarySource_get_data((BinarySource *)subsrc[0]._24_8_,curve_00->fieldBytes);
      if ((*(int *)(subsrc[0]._24_8_ + 0x18) == 0) &&
         (*(long *)(subsrc[0]._24_8_ + 0x10) == *(long *)(subsrc[0]._24_8_ + 8))) {
        _Var1 = ptrlen_eq_ptrlen(pl1,pl2);
        if (_Var1) {
          puVar2 = (undefined8 *)safemalloc(1,0x20,0);
          puVar2[3] = alg;
          *puVar2 = curve_00;
          puVar2[2] = 0;
          pEVar3 = eddsa_decode(pl1,curve_00);
          puVar2[1] = pEVar3;
          if (puVar2[1] == 0) {
            eddsa_freekey((ssh_key *)(puVar2 + 3));
            alg_local = (ssh_keyalg *)0x0;
          }
          else {
            pmVar4 = mp_from_bytes_le(pVar5);
            puVar2[2] = pmVar4;
            alg_local = (ssh_keyalg *)(puVar2 + 3);
          }
        }
        else {
          alg_local = (ssh_keyalg *)0x0;
        }
      }
      else {
        alg_local = (ssh_keyalg *)0x0;
      }
    }
    else {
      alg_local = (ssh_keyalg *)0x0;
    }
    return (ssh_key *)alg_local;
  }
  __assert_fail("curve->type == EC_EDWARDS",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/ecc-ssh.c"
                ,0x34d,"ssh_key *eddsa_new_priv_openssh(const ssh_keyalg *, BinarySource *)");
}

Assistant:

static ssh_key *eddsa_new_priv_openssh(
    const ssh_keyalg *alg, BinarySource *src)
{
    const struct ecsign_extra *extra =
        (const struct ecsign_extra *)alg->extra;
    struct ec_curve *curve = extra->curve();
    assert(curve->type == EC_EDWARDS);

    ptrlen pubkey_pl = get_string(src);
    ptrlen privkey_extended_pl = get_string(src);
    if (get_err(src) || pubkey_pl.len != curve->fieldBytes)
        return NULL;

    /*
     * The OpenSSH format for ed25519 private keys also for some
     * reason encodes an extra copy of the public key in the second
     * half of the secret-key string. Check that that's present and
     * correct as well, otherwise the key we think we've imported
     * won't behave identically to the way OpenSSH would have treated
     * it.
     *
     * We assume that Ed448 will work the same way, as and when
     * OpenSSH implements it, which at the time of writing this they
     * had not.
     */
    BinarySource subsrc[1];
    BinarySource_BARE_INIT_PL(subsrc, privkey_extended_pl);
    ptrlen privkey_pl = get_data(subsrc, curve->fieldBytes);
    ptrlen pubkey_copy_pl = get_data(subsrc, curve->fieldBytes);
    if (get_err(subsrc) || get_avail(subsrc))
        return NULL;
    if (!ptrlen_eq_ptrlen(pubkey_pl, pubkey_copy_pl))
        return NULL;

    struct eddsa_key *ek = snew(struct eddsa_key);
    ek->sshk.vt = alg;
    ek->curve = curve;
    ek->privateKey = NULL;

    ek->publicKey = eddsa_decode(pubkey_pl, curve);
    if (!ek->publicKey) {
        eddsa_freekey(&ek->sshk);
        return NULL;
    }

    ek->privateKey = mp_from_bytes_le(privkey_pl);

    return &ek->sshk;
}